

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O0

void assert_parse_object(char *json)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  char *json_local;
  parse_buffer parsebuffer;
  
  parsebuffer.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  memset(&json_local,0,0x38);
  json_local = json;
  sVar2 = strlen(json);
  parsebuffer.content = (uchar *)(sVar2 + 1);
  parsebuffer.depth = (size_t)global_hooks.allocate;
  parsebuffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  parsebuffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  cVar1 = parse_object(item,(parse_buffer *)&json_local);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x48);
  }
  assert_is_object(item);
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) != parsebuffer.hooks.reallocate) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_parse_object(const char *json)
{
    parse_buffer parsebuffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    parsebuffer.content = (const unsigned char*)json;
    parsebuffer.length = strlen(json) + sizeof("");
    parsebuffer.hooks = global_hooks;

    TEST_ASSERT_TRUE(parse_object(item, &parsebuffer));
    assert_is_object(item);
}